

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFFileSpecObjectHelper::getEmbeddedFileStreams(QPDFFileSpecObjectHelper *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar1;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [24];
  QPDFFileSpecObjectHelper *this_local;
  
  this_local = this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"/EF",&local_49);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFFileSpecObjectHelper::getEmbeddedFileStreams()
{
    return oh().getKey("/EF");
}